

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O0

shared_ptr<cxxopts::Value> __thiscall
cxxopts::values::abstract_value<unsigned_int>::implicit_value
          (abstract_value<unsigned_int> *this,string *value)

{
  string *in_RDX;
  long in_RSI;
  element_type *in_RDI;
  shared_ptr<cxxopts::Value> sVar1;
  enable_shared_from_this<cxxopts::Value> *in_stack_ffffffffffffffc8;
  
  *(undefined1 *)(in_RSI + 0x31) = 1;
  std::__cxx11::string::operator=((string *)(in_RSI + 0x58),in_RDX);
  sVar1 = std::enable_shared_from_this<cxxopts::Value>::shared_from_this(in_stack_ffffffffffffffc8);
  sVar1.super___shared_ptr<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<cxxopts::Value>)
         sVar1.super___shared_ptr<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Value>
  implicit_value(const std::string& value) override
  {
    m_implicit = true;
    m_implicit_value = value;
    return shared_from_this();
  }